

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Computations.h
# Opt level: O3

int GetAllObstaclesDist5
              (uchar *scanline,uchar threshold,int diffstep,double minDist,double maxDist,int NBins,
              int RangeScale,uchar ADLow,uchar ADSpan,int adc8on,
              vector<interval,_std::allocator<interval>_> *distances)

{
  uint uVar1;
  void *__ptr;
  long lVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  double *a;
  ulong uVar6;
  byte bVar7;
  char cVar8;
  undefined7 in_register_00000089;
  int iVar9;
  double dVar10;
  double dVar11;
  double local_80;
  double local_78;
  double local_70;
  uint local_68;
  int local_64;
  double local_60;
  double local_58;
  double local_50;
  interval local_48;
  
  local_68 = (uint)CONCAT71(in_register_00000089,ADLow);
  local_60 = (double)NBins;
  local_78 = (double)RangeScale;
  uVar1 = (uint)(minDist * (local_60 / local_78));
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = uVar1;
  }
  iVar9 = (int)((local_60 / local_78) * maxDist);
  if (NBins + -1 < iVar9) {
    iVar9 = NBins + -1;
  }
  local_80 = -1.0;
  local_70 = -1.0;
  local_64 = diffstep;
  local_50 = maxDist;
  __ptr = malloc((long)NBins);
  if (__ptr == (void *)0x0) {
    iVar9 = 1;
  }
  else {
    uVar5 = (ulong)uVar4;
    if ((int)uVar4 <= iVar9) {
      uVar6 = uVar5;
      do {
        bVar7 = scanline[uVar6];
        if (adc8on == 0) {
LAB_00194107:
          cVar8 = (bVar7 < threshold) + -1;
        }
        else {
          if (bVar7 <= (byte)local_68) {
            bVar7 = 0;
            goto LAB_00194107;
          }
          cVar8 = -1;
          if ((uint)bVar7 < (uint)ADSpan + (local_68 & 0xff)) {
            bVar7 = (byte)(int)(((double)(int)((uint)bVar7 - (local_68 & 0xff)) * 255.0) /
                               (double)ADSpan);
            goto LAB_00194107;
          }
        }
        *(char *)((long)__ptr + uVar6) = cVar8;
        uVar6 = uVar6 + 1;
      } while (iVar9 + 1 != uVar6);
    }
    if ((int)uVar4 <= iVar9 - local_64) {
      local_78 = local_78 / local_60;
      lVar2 = (long)local_64;
      uVar6 = (ulong)((iVar9 - local_64) + 1);
      dVar10 = -1.0;
      dVar11 = local_78;
      do {
        while( true ) {
          iVar9 = (uint)*(byte *)((long)__ptr + uVar5 + lVar2) -
                  (uint)*(byte *)((long)__ptr + uVar5);
          cVar8 = (char)iVar9;
          cVar3 = -cVar8;
          if (0 < iVar9) {
            cVar3 = cVar8;
          }
          if (cVar3 != -1) break;
          if (dVar10 < 0.0) {
            dVar10 = (double)(int)uVar5 * dVar11;
            local_80 = dVar10;
          }
LAB_00194199:
          uVar5 = uVar5 + 1;
          if (uVar5 == uVar6) {
            if (0.0 <= dVar10) {
              a = &local_80;
              goto LAB_00194256;
            }
            goto LAB_0019421c;
          }
        }
        if (dVar10 < 0.0) goto LAB_00194199;
        local_70 = (double)((int)uVar5 + -1) * dVar11;
        interval::interval(&local_48,&local_80,&local_70);
        std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
                  (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
        local_80 = -1.0;
        local_70 = -1.0;
        uVar5 = uVar5 + 1;
        dVar10 = -1.0;
        dVar11 = local_78;
      } while (uVar5 != uVar6);
    }
LAB_0019421c:
    a = &local_50;
LAB_00194256:
    local_58 = INFINITY;
    interval::interval(&local_48,a,&local_58);
    std::vector<interval,_std::allocator<interval>_>::emplace_back<interval>
              (distances,(vector<interval,_std::allocator<interval>_> *)&local_48);
    free(__ptr);
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

inline int GetAllObstaclesDist5(unsigned char* scanline, unsigned char threshold, int diffstep, double minDist, double maxDist, 
								int NBins, int RangeScale, unsigned char ADLow, unsigned char ADSpan, int adc8on, vector<interval>& distances)
{
	double r0 = (double)NBins/(double)RangeScale;
	double r1 = (double)RangeScale/(double)NBins;
	int minBin = max(0, (int)(minDist*r0));
	int maxBin = min(NBins-1, (int)(maxDist*r0));
	int i = 0;
	double d0 = -1, d1 = -1;
	unsigned char* scanlinethreshhold = NULL;

	scanlinethreshhold = (unsigned char*)malloc(NBins*sizeof(unsigned char));
	if (scanlinethreshhold == NULL)
	{
		return EXIT_FAILURE;
	}

	i = minBin;
	while (i <= maxBin)
	{
		if (DynamicRangeControl(scanline[i], ADLow, ADSpan, adc8on) >= threshold)
		{
			scanlinethreshhold[i] = 255;
		}
		else
		{
			scanlinethreshhold[i] = 0;
		}
		i++;
	}

	i = minBin;
	while (i <= maxBin-diffstep)
	{
		if (abs((int)(scanlinethreshhold[i+diffstep]-scanlinethreshhold[i])) >= 255)
		{
			if (d0 < 0) 
			{
				d0 = (double)i*r1; // Convert in m.
			}
		}
		else
		{
			if (d0 >= 0) 
			{
				d1 = (double)(i-1)*r1; // Convert in m.
				distances.push_back(interval(d0, d1));
				d0 = -1;
				d1 = -1;
			}
		}
		i++;
	}

	if (d0 >= 0) 
	{
		distances.push_back(interval(d0, oo));
	}
	else
	{
		distances.push_back(interval(maxDist, oo));
	}

	free(scanlinethreshhold);

	return EXIT_SUCCESS;
}